

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTNode * ParseIf(Scope *scope,Lexer *lexer)

{
  Token tok;
  int iVar1;
  ASTNode *pAVar2;
  ASTNode *pAVar3;
  char *pcVar4;
  
  pAVar2 = GetNextNode(scope);
  pAVar2->isStmt = true;
  pAVar2->type = IF;
  tok = GetNextToken(lexer);
  if (tok == LPAREN) {
    pAVar3 = ParseExpression(scope,lexer);
    (pAVar2->meta).binaryExpr.left = pAVar3;
    iVar1 = ParseBody(scope,lexer);
    (pAVar2->meta).ifExpr.body = iVar1;
    return pAVar2;
  }
  pcVar4 = TokenToString(tok);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar4,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTNode* ParseIf(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("If");
	TRACK();
	ASTNode* ifExpr = GetNextNode(scope);
	SET_IS_STMT(ifExpr);
	SET_NODE_TYPE(ifExpr, IF);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	SET_IF_CONDITION(ifExpr, ParseExpression(scope, lexer));
	SET_IF_BODY(ifExpr, ParseBody(scope, lexer));
	return ifExpr;
}